

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

void __thiscall
entt::sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>::publish
          (sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)> *this,
          entity args,basic_registry<entt::entity> *args_1,Swarm *args_2)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(this->calls).
                super__Vector_base<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->calls).
                super__Vector_base<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar2 = lVar1 >> 4;
    do {
      lVar1 = lVar1 + -0x10;
      delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>::operator()
                ((this->calls).
                 super__Vector_base<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar1,args,args_1,args_2);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

constexpr bool operator==(const basic_hashed_string &other) const ENTT_NOEXCEPT {
        return hash == other.hash;
    }